

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

bool __thiscall
cmFindBase::ParseArguments
          (cmFindBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *argsIn)

{
  cmMakefile *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  string_view name;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  optional<cmWindowsRegistry::View> oVar6;
  cmState *this_01;
  cmValue cVar7;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  uint uVar11;
  uint uVar12;
  cmFindBase *this_02;
  anon_class_8_1_d1845f1d_for__M_pred __pred;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  undefined4 uVar13;
  ulong uVar14;
  cmFindCommon *this_03;
  bool bVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  shortArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  macros;
  Command command;
  char local_139;
  _Alloc_hider in_stack_fffffffffffffec8;
  _Alloc_hider _Var16;
  char *in_stack_fffffffffffffed0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  cmFindCommon *local_f0;
  string *local_e8;
  cmFindBase *local_e0;
  undefined1 local_d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_60;
  string *local_58;
  _Any_data local_50;
  code *local_40;
  
  uVar14 = (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(argsIn->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (uVar14 < 2) {
    _Var16._M_p = (pointer)local_128;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffec8,"called with incorrect number of arguments","");
    cmFindCommon::SetError(&this->super_cmFindCommon,(string *)&stack0xfffffffffffffec8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var16._M_p != local_128) {
      operator_delete(_Var16._M_p,local_128[0]._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e8 = (string *)&this->VariableDocumentation;
    uVar5 = 0;
    bVar3 = false;
    uVar12 = 0;
    local_e0 = this;
    do {
      if ((bVar3) ||
         (iVar4 = std::__cxx11::string::compare
                            ((char *)((argsIn->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar5)),
         iVar4 != 0)) {
        iVar4 = std::__cxx11::string::compare
                          ((char *)((argsIn->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + uVar5));
        if (iVar4 == 0) {
          local_e0->StoreResultInCache = false;
        }
        else {
          iVar4 = std::__cxx11::string::compare
                            ((char *)((argsIn->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + uVar5));
          if (iVar4 == 0) {
            uVar11 = uVar12 + 1;
            if (uVar11 < uVar14) {
              cmsys::SystemTools::GetPath
                        (&local_108,
                         (argsIn->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p);
              uVar12 = uVar11;
            }
          }
          else {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&local_108,
                        (argsIn->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar5);
          }
        }
      }
      else if (uVar12 + 1 < uVar14) {
        bVar3 = true;
        std::__cxx11::string::_M_assign(local_e8);
        uVar12 = uVar12 + 1;
      }
      this_02 = local_e0;
      uVar12 = uVar12 + 1;
      uVar5 = (ulong)uVar12;
    } while (uVar5 < uVar14);
    if ((ulong)((long)local_108.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_108.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      _Var16._M_p = (pointer)local_128;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffec8,"called with incorrect number of arguments","");
      cmFindCommon::SetError(&local_e0->super_cmFindCommon,(string *)&stack0xfffffffffffffec8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var16._M_p != local_128) {
LAB_0053e815:
        operator_delete(_Var16._M_p,local_128[0]._M_allocated_capacity + 1);
      }
LAB_0053e822:
      bVar3 = false;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_e0->VariableName);
      bVar3 = CheckForVariableDefined(this_02);
      if (bVar3) {
        this_02->AlreadyDefined = true;
        bVar3 = true;
      }
      else {
        this_03 = &this_02->super_cmFindCommon;
        cmFindCommon::SelectDefaultSearchModes(this_03);
        cmFindCommon::SelectDefaultRootPathMode(this_03);
        cmFindCommon::SelectDefaultMacMode(this_03);
        bVar3 = (ulong)((long)local_108.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_108.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) < 0x21;
        if (bVar3) {
          bVar15 = false;
        }
        else {
          local_60 = &(this_02->super_cmFindCommon).UserGuessArgs;
          local_68 = &this_02->Names;
          local_58 = (string *)&this_02->ValidatorName;
          uVar13 = 1;
          bVar15 = false;
          uVar14 = 1;
          local_f0 = this_03;
          do {
            uVar12 = (uint)uVar14;
            iVar4 = std::__cxx11::string::compare
                              ((char *)(local_108.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar14));
            if (iVar4 == 0) {
              uVar13 = 1;
LAB_0053ea3e:
              bVar15 = true;
            }
            else {
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_108.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar4 == 0) {
                uVar13 = 2;
                goto LAB_0053ea3e;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_108.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar4 == 0) {
                uVar13 = 4;
                goto LAB_0053ea3e;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_108.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar4 == 0) {
                uVar13 = 3;
                goto LAB_0053ea3e;
              }
              iVar4 = std::__cxx11::string::compare
                                ((char *)(local_108.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14));
              if (iVar4 == 0) {
                if (this_02->NamesPerDirAllowed != true) {
                  _Var16._M_p = (pointer)local_128;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&stack0xfffffffffffffec8,"does not support NAMES_PER_DIR","")
                  ;
                  cmFindCommon::SetError(local_f0,(string *)&stack0xfffffffffffffec8);
                  goto LAB_0053f0a4;
                }
                this_02->NamesPerDir = true;
LAB_0053ea84:
                uVar13 = 0;
              }
              else {
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_108.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar4 == 0) {
                  (this_02->super_cmFindCommon).NoDefaultPath = true;
                  goto LAB_0053ea84;
                }
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_108.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar4 == 0) {
                  this_02->Required = true;
                  uVar13 = 0;
                  goto LAB_0053ea3e;
                }
                iVar4 = std::__cxx11::string::compare
                                  ((char *)(local_108.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar14));
                if (iVar4 == 0) {
                  uVar12 = uVar12 + 1;
                  uVar14 = (ulong)uVar12;
                  if ((long)local_108.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_108.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar14) {
                    _Var16._M_p = (pointer)local_128;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&stack0xfffffffffffffec8,
                               "missing required argument for \"REGISTRY_VIEW\"","");
                    cmFindCommon::SetError(local_f0,(string *)&stack0xfffffffffffffec8);
LAB_0053f0a4:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var16._M_p == local_128) goto LAB_0053e822;
                    goto LAB_0053e815;
                  }
                  name._M_str = in_stack_fffffffffffffed0;
                  name._M_len = (size_t)in_stack_fffffffffffffec8._M_p;
                  oVar6 = cmWindowsRegistry::ToView(name);
                  if (((ulong)oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                              _M_payload.super__Optional_payload_base<cmWindowsRegistry::View> >>
                       0x20 & 1) == 0) {
                    local_128[0]._8_8_ =
                         local_108.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
                    local_128[0]._0_8_ =
                         local_108.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length;
                    in_stack_fffffffffffffec8._M_p = (pointer)0x29;
                    in_stack_fffffffffffffed0 = "given invalid value for \"REGISTRY_VIEW\": ";
                    views._M_len = 2;
                    views._M_array = (iterator)&stack0xfffffffffffffec8;
                    cmCatViews_abi_cxx11_((string *)local_d8,views);
                    cmFindCommon::SetError(local_f0,(string *)local_d8);
                    if ((pointer)local_d8._0_8_ != &local_c8) {
                      operator_delete((void *)local_d8._0_8_,(long)local_c8._M_dataplus._M_p + 1);
                    }
                  }
                  else {
                    (local_e0->super_cmFindCommon).RegistryView =
                         oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>._M_payload.
                         super__Optional_payload_base<cmWindowsRegistry::View>._M_payload;
                  }
                  this_02 = local_e0;
                  if (((ulong)oVar6.super__Optional_base<cmWindowsRegistry::View,_true,_true>.
                              _M_payload.super__Optional_payload_base<cmWindowsRegistry::View> >>
                       0x20 & 1) == 0) goto LAB_0053e822;
                }
                else {
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)(local_108.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start + uVar14));
                  if (iVar4 == 0) {
                    uVar12 = uVar12 + 1;
                    uVar14 = (ulong)uVar12;
                    if ((long)local_108.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_108.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5 == uVar14) {
                      _Var16._M_p = (pointer)local_128;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&stack0xfffffffffffffec8,
                                 "missing required argument for \"VALIDATOR\"","");
                      cmFindCommon::SetError(local_f0,(string *)&stack0xfffffffffffffec8);
                      goto LAB_0053f0a4;
                    }
                    this_01 = cmMakefile::GetState((this_02->super_cmFindCommon).Makefile);
                    cmState::GetCommand((Command *)&local_50,this_01,
                                        local_108.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar14);
                    if (local_40 == (code *)0x0) {
                      local_d8._8_8_ =
                           local_108.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
                      local_d8._0_8_ =
                           local_108.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length;
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)CONCAT71(local_88.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2e);
                      cmStrCat<char>(&local_a8,(cmAlphaNum *)&stack0xfffffffffffffec8,
                                     (cmAlphaNum *)local_d8,(char *)&local_88);
                      cmFindCommon::SetError(local_f0,&local_a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        local_a8.field_2._M_allocated_capacity + 1);
                      }
                      if (local_40 != (code *)0x0) {
                        (*local_40)(&local_50,&local_50,__destroy_functor);
                      }
                      goto LAB_0053e822;
                    }
                    __pred.validatorName =
                         local_108.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar14;
                    this_00 = (this_02->super_cmFindCommon).Makefile;
                    in_stack_fffffffffffffec8._M_p = (pointer)local_128;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&stack0xfffffffffffffec8,"MACROS","");
                    cVar7 = cmMakefile::GetProperty(this_00,(string *)&stack0xfffffffffffffec8);
                    if (cVar7.Value == (string *)0x0) {
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                      local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    }
                    else {
                      arg._M_str = ((cVar7.Value)->_M_dataplus)._M_p;
                      arg._M_len = (cVar7.Value)->_M_string_length;
                      cmExpandedList_abi_cxx11_(&local_88,arg,false);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)in_stack_fffffffffffffec8._M_p != local_128) {
                      operator_delete(in_stack_fffffffffffffec8._M_p,
                                      local_128[0]._M_allocated_capacity + 1);
                    }
                    _Var8 = std::
                            find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmFindBase::ParseArguments(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start,
                                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        )local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,__pred);
                    pbVar2 = local_88.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                    if (_Var8._M_current ==
                        local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      std::__cxx11::string::_M_assign(local_58);
                    }
                    else {
                      in_stack_fffffffffffffec8._M_p = (pointer)0x35;
                      in_stack_fffffffffffffed0 =
                           "command specified for \"VALIDATOR\" is not a function: ";
                      local_d8._8_8_ =
                           local_108.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_dataplus._M_p;
                      local_d8._0_8_ =
                           local_108.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar14]._M_string_length;
                      local_139 = '.';
                      cmStrCat<char>(&local_a8,(cmAlphaNum *)&stack0xfffffffffffffec8,
                                     (cmAlphaNum *)local_d8,&local_139);
                      cmFindCommon::SetError(local_f0,&local_a8);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                        operator_delete(local_a8._M_dataplus._M_p,
                                        local_a8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_88);
                    if (local_40 != (code *)0x0) {
                      (*local_40)(&local_50,&local_50,__destroy_functor);
                    }
                    this_02 = local_e0;
                    if (_Var8._M_current != pbVar2) goto LAB_0053e822;
                  }
                  else {
                    bVar3 = cmFindCommon::CheckCommonArgument
                                      (local_f0,local_108.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start + uVar14);
                    if (bVar3) goto LAB_0053ea84;
                    switch(uVar13) {
                    case 1:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_68,local_108.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar14);
                      uVar13 = 1;
                      break;
                    case 2:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(local_60,local_108.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar14);
                      uVar13 = 2;
                      break;
                    case 3:
                      cmFindCommon::AddPathSuffix
                                (local_f0,local_108.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar14);
                      uVar13 = 3;
                      break;
                    case 4:
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::push_back(&local_f0->UserHintsArgs,
                                  local_108.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar14);
                      uVar13 = 4;
                    }
                  }
                }
              }
            }
            uVar14 = (ulong)(uVar12 + 1);
            uVar5 = (long)local_108.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_108.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            bVar3 = uVar5 <= uVar14;
            this_03 = local_f0;
          } while (uVar14 < uVar5);
        }
        if ((this_02->VariableDocumentation)._M_string_length == 0) {
          std::__cxx11::string::_M_replace((ulong)local_e8,0,(char *)0x0,0x7a8dd6);
          __rhs = (this_02->Names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          pbVar1 = (this_02->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (__rhs == pbVar1) {
            std::__cxx11::string::append((char *)local_e8);
          }
          else {
            if ((long)pbVar1 - (long)__rhs == 0x20) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8,"the ",__rhs);
              plVar9 = (long *)std::__cxx11::string::append(local_d8);
              _Var16._M_p = (pointer)local_128;
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 == paVar10) {
                local_128[0]._0_8_ = paVar10->_M_allocated_capacity;
                local_128[0]._8_8_ = plVar9[3];
              }
              else {
                local_128[0]._0_8_ = paVar10->_M_allocated_capacity;
                _Var16._M_p = (pointer)*plVar9;
              }
              in_stack_fffffffffffffed0 = (char *)plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_e8,(ulong)_Var16._M_p);
            }
            else {
              std::__cxx11::string::append((char *)local_e8);
              local_d8._0_8_ =
                   (this_02->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_d8._8_8_ =
                   (this_02->Names).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + -1;
              separator._M_str = ", ";
              separator._M_len = 2;
              cmJoin((string *)&stack0xfffffffffffffec8,(cmStringRange *)local_d8,separator,
                     (string_view)ZEXT816(0));
              std::__cxx11::string::_M_append
                        ((char *)local_e8,(ulong)in_stack_fffffffffffffec8._M_p);
              _Var16._M_p = (pointer)local_128;
              if (in_stack_fffffffffffffec8._M_p != _Var16._M_p) {
                operator_delete(in_stack_fffffffffffffec8._M_p,
                                local_128[0]._M_allocated_capacity + 1);
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_d8," or ",
                             (this_02->Names).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
              plVar9 = (long *)std::__cxx11::string::append(local_d8);
              paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(plVar9 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar9 == paVar10) {
                local_128[0]._0_8_ = paVar10->_M_allocated_capacity;
                local_128[0]._8_8_ = plVar9[3];
              }
              else {
                local_128[0]._0_8_ = paVar10->_M_allocated_capacity;
                _Var16._M_p = (pointer)*plVar9;
              }
              in_stack_fffffffffffffed0 = (char *)plVar9[1];
              *plVar9 = (long)paVar10;
              plVar9[1] = 0;
              *(undefined1 *)(plVar9 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_e8,(ulong)_Var16._M_p);
            }
            in_stack_fffffffffffffec8._M_p = _Var16._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var16._M_p != local_128) {
              operator_delete(_Var16._M_p,local_128[0]._M_allocated_capacity + 1);
              in_stack_fffffffffffffec8._M_p = _Var16._M_p;
            }
            if ((pointer)local_d8._0_8_ != &local_c8) {
              operator_delete((void *)local_d8._0_8_,(long)local_c8._M_dataplus._M_p + 1);
            }
          }
        }
        if ((!bVar15) &&
           ((this_02->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this_02->Names).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          __x = &this_02->Names;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xfffffffffffffec8,__x);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_erase_at_end(__x,(__x->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(__x,(value_type *)in_stack_fffffffffffffec8._M_p);
          this_02 = local_e0;
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &(local_e0->super_cmFindCommon).UserGuessArgs,
                     (local_e0->super_cmFindCommon).UserGuessArgs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     in_stack_fffffffffffffec8._M_p + 0x20,in_stack_fffffffffffffed0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xfffffffffffffec8);
        }
        ExpandPaths(this_02);
        cmFindCommon::ComputeFinalPaths(this_03,Yes);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
  }
  return bVar3;
}

Assistant:

bool cmFindBase::ParseArguments(std::vector<std::string> const& argsIn)
{
  if (argsIn.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // copy argsIn into args so it can be modified,
  // in the process extract the DOC "documentation"
  // and handle options NO_CACHE and ENV
  size_t size = argsIn.size();
  std::vector<std::string> args;
  bool foundDoc = false;
  for (unsigned int j = 0; j < size; ++j) {
    if (foundDoc || argsIn[j] != "DOC") {
      if (argsIn[j] == "NO_CACHE") {
        this->StoreResultInCache = false;
      } else if (argsIn[j] == "ENV") {
        if (j + 1 < size) {
          j++;
          cmSystemTools::GetPath(args, argsIn[j].c_str());
        }
      } else {
        args.push_back(argsIn[j]);
      }
    } else {
      if (j + 1 < size) {
        foundDoc = true;
        this->VariableDocumentation = argsIn[j + 1];
        j++;
        if (j >= size) {
          break;
        }
      }
    }
  }
  if (args.size() < 2) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  this->VariableName = args[0];
  if (this->CheckForVariableDefined()) {
    this->AlreadyDefined = true;
    return true;
  }

  // Find what search path locations have been enabled/disable
  this->SelectDefaultSearchModes();

  // Find the current root path mode.
  this->SelectDefaultRootPathMode();

  // Find the current bundle/framework search policy.
  this->SelectDefaultMacMode();

  bool newStyle = false;
  enum Doing
  {
    DoingNone,
    DoingNames,
    DoingPaths,
    DoingPathSuffixes,
    DoingHints
  };
  Doing doing = DoingNames; // assume it starts with a name
  for (unsigned int j = 1; j < args.size(); ++j) {
    if (args[j] == "NAMES") {
      doing = DoingNames;
      newStyle = true;
    } else if (args[j] == "PATHS") {
      doing = DoingPaths;
      newStyle = true;
    } else if (args[j] == "HINTS") {
      doing = DoingHints;
      newStyle = true;
    } else if (args[j] == "PATH_SUFFIXES") {
      doing = DoingPathSuffixes;
      newStyle = true;
    } else if (args[j] == "NAMES_PER_DIR") {
      doing = DoingNone;
      if (this->NamesPerDirAllowed) {
        this->NamesPerDir = true;
      } else {
        this->SetError("does not support NAMES_PER_DIR");
        return false;
      }
    } else if (args[j] == "NO_SYSTEM_PATH") {
      doing = DoingNone;
      this->NoDefaultPath = true;
    } else if (args[j] == "REQUIRED") {
      doing = DoingNone;
      this->Required = true;
      newStyle = true;
    } else if (args[j] == "REGISTRY_VIEW") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"REGISTRY_VIEW\"");
        return false;
      }
      auto view = cmWindowsRegistry::ToView(args[j]);
      if (view) {
        this->RegistryView = *view;
      } else {
        this->SetError(
          cmStrCat("given invalid value for \"REGISTRY_VIEW\": ", args[j]));
        return false;
      }
    } else if (args[j] == "VALIDATOR") {
      if (++j == args.size()) {
        this->SetError("missing required argument for \"VALIDATOR\"");
        return false;
      }
      auto command = this->Makefile->GetState()->GetCommand(args[j]);
      if (command == nullptr) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is undefined: ", args[j], '.'));
        return false;
      }
      // ensure a macro is not specified as validator
      const auto& validatorName = args[j];
      auto macros = cmExpandedList(this->Makefile->GetProperty("MACROS"));
      if (std::find_if(macros.begin(), macros.end(),
                       [&validatorName](const std::string& item) {
                         return cmSystemTools::Strucmp(validatorName.c_str(),
                                                       item.c_str()) == 0;
                       }) != macros.end()) {
        this->SetError(cmStrCat(
          "command specified for \"VALIDATOR\" is not a function: ", args[j],
          '.'));
        return false;
      }
      this->ValidatorName = args[j];
    } else if (this->CheckCommonArgument(args[j])) {
      doing = DoingNone;
    } else {
      // Some common arguments were accidentally supported by CMake
      // 2.4 and 2.6.0 in the short-hand form of the command, so we
      // must support it even though it is not documented.
      if (doing == DoingNames) {
        this->Names.push_back(args[j]);
      } else if (doing == DoingPaths) {
        this->UserGuessArgs.push_back(args[j]);
      } else if (doing == DoingHints) {
        this->UserHintsArgs.push_back(args[j]);
      } else if (doing == DoingPathSuffixes) {
        this->AddPathSuffix(args[j]);
      }
    }
  }

  if (this->VariableDocumentation.empty()) {
    this->VariableDocumentation = "Where can ";
    if (this->Names.empty()) {
      this->VariableDocumentation += "the (unknown) library be found";
    } else if (this->Names.size() == 1) {
      this->VariableDocumentation +=
        "the " + this->Names.front() + " library be found";
    } else {
      this->VariableDocumentation += "one of the ";
      this->VariableDocumentation +=
        cmJoin(cmMakeRange(this->Names).retreat(1), ", ");
      this->VariableDocumentation +=
        " or " + this->Names.back() + " libraries be found";
    }
  }

  // look for old style
  // FIND_*(VAR name path1 path2 ...)
  if (!newStyle && !this->Names.empty()) {
    // All the short-hand arguments have been recorded as names.
    std::vector<std::string> shortArgs = this->Names;
    this->Names.clear(); // clear out any values in Names
    this->Names.push_back(shortArgs[0]);
    cm::append(this->UserGuessArgs, shortArgs.begin() + 1, shortArgs.end());
  }
  this->ExpandPaths();

  this->ComputeFinalPaths(IgnorePaths::Yes);

  return true;
}